

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
Model_removeImportedUnitsByReference_Test::~Model_removeImportedUnitsByReference_Test
          (Model_removeImportedUnitsByReference_Test *this)

{
  Model_removeImportedUnitsByReference_Test *this_local;
  
  ~Model_removeImportedUnitsByReference_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Model, removeImportedUnitsByReference)
{
    auto model = commonSetupImportedUnits();
    auto myConcreteUnits = model->units(0);
    auto myImportedUnits = model->units(1);

    EXPECT_TRUE(model->removeUnits(myConcreteUnits));
    EXPECT_TRUE(model->removeUnits(myImportedUnits));

    EXPECT_EQ(size_t(0), model->unitsCount());
}